

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.hpp
# Opt level: O1

void foxxll::print_library_version_mismatch(void)

{
  int iVar1;
  ostream *poVar2;
  ostringstream oss__;
  char local_1a9;
  string local_1a8;
  ostringstream local_188 [376];
  
  iVar1 = version_major();
  if (iVar1 == 1) {
    iVar1 = version_minor();
    if (iVar1 == 4) {
      iVar1 = version_patch();
      if (iVar1 == 99) {
        return;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"DIE: ",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"version mismatch between headers (",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"1.4.99) and library (",0x15);
  get_library_version_string_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," @ ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/version.hpp"
             ,0x5a);
  local_1a9 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
  std::ostream::operator<<((ostream *)poVar2,0x5c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  tlx::die_with_message(&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::terminate();
}

Assistant:

inline int check_library_version()
{
    if (version_major() != FOXXLL_VERSION_MAJOR)
        return 1;
    if (version_minor() != FOXXLL_VERSION_MINOR)
        return 2;
    if (version_patch() != FOXXLL_VERSION_PATCH)
        return 3;
    return 0;
}